

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void http_on_server_protocol_http1(intptr_t uuid,void *set,void *ignr_)

{
  fio_protocol_s *pfVar1;
  fio_protocol_s *pr;
  void *ignr__local;
  void *set_local;
  intptr_t uuid_local;
  
  fio_timeout_set(uuid,*(uint8_t *)((long)set + 0x78));
  if ((long)(int)((ulong)uuid >> 8) < *(long *)((long)set + 0x48)) {
    fio_http_at_capa = '\0';
    pfVar1 = http1_new(uuid,(http_settings_s *)set,(void *)0x0,0);
    if (pfVar1 == (fio_protocol_s *)0x0) {
      fio_close(uuid);
    }
  }
  else {
    if ((fio_http_at_capa == '\0') && (2 < FIO_LOG_LEVEL)) {
      FIO_LOG2STDERR("WARNING: HTTP server at capacity");
    }
    fio_http_at_capa = '\x01';
    http_send_error2(uuid,0x1f7,(http_settings_s *)set);
    fio_close(uuid);
  }
  return;
}

Assistant:

static void http_on_server_protocol_http1(intptr_t uuid, void *set,
                                          void *ignr_) {
  fio_timeout_set(uuid, ((http_settings_s *)set)->timeout);
  if (fio_uuid2fd(uuid) >= ((http_settings_s *)set)->max_clients) {
    if (!fio_http_at_capa)
      FIO_LOG_WARNING("HTTP server at capacity");
    fio_http_at_capa = 1;
    http_send_error2(uuid, 503, set);
    fio_close(uuid);
    return;
  }
  fio_http_at_capa = 0;
  fio_protocol_s *pr = http1_new(uuid, set, NULL, 0);
  if (!pr)
    fio_close(uuid);
  (void)ignr_;
}